

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * roaring_bitmap_aligned_malloc(size_t alignment,size_t size)

{
  int iVar1;
  size_t in_RSI;
  size_t in_RDI;
  void *p;
  void *local_20 [3];
  void *local_8;
  
  iVar1 = posix_memalign(local_20,in_RDI,in_RSI);
  if (iVar1 == 0) {
    local_8 = local_20[0];
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static void* roaring_bitmap_aligned_malloc(size_t alignment, size_t size) {
    void* p;
#ifdef _MSC_VER
    p = _aligned_malloc(size, alignment);
#elif defined(__MINGW32__) || defined(__MINGW64__)
    p = __mingw_aligned_malloc(size, alignment);
#else
    // somehow, if this is used before including "x86intrin.h", it creates an
    // implicit defined warning.
    if (posix_memalign(&p, alignment, size) != 0) return NULL;
#endif
    return p;
}